

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<boost::runtime::argument>::
shared_ptr<boost::runtime::typed_argument<boost::unit_test::log_level>>
          (shared_ptr<boost::runtime::argument> *this,typed_argument<boost::unit_test::log_level> *p
          )

{
  this->px = &p->super_argument;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::
  sp_pointer_construct<boost::runtime::argument,boost::runtime::typed_argument<boost::unit_test::log_level>>
            (this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }